

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O3

void __thiscall Character::AddPaperdollData(Character *this,PacketBuilder *builder,char *format)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  EIF_Data *pEVar5;
  EIF_Data *pEVar6;
  uint uVar7;
  uint uVar8;
  char *p;
  uint uVar9;
  uint uVar10;
  
  pEVar5 = EIF::Get(this->world->eif,(this->paperdoll)._M_elems[8]);
  pEVar6 = EIF::Get(this->world->eif,(this->paperdoll)._M_elems[0]);
  uVar10 = (pEVar6->field_25).scrollmap;
  pEVar6 = EIF::Get(this->world->eif,(this->paperdoll)._M_elems[4]);
  uVar8 = (pEVar6->field_25).scrollmap;
  pEVar6 = EIF::Get(this->world->eif,(this->paperdoll)._M_elems[6]);
  uVar2 = (pEVar6->field_25).scrollmap;
  uVar3 = (pEVar5->field_25).scrollmap;
  pEVar6 = EIF::Get(this->world->eif,(this->paperdoll)._M_elems[7]);
  uVar9 = (uint)(pEVar5->field_27).scrolly;
  if ((pEVar5->field_27).scrolly == 0) {
    uVar9 = (pEVar6->field_25).scrollmap;
  }
  if (pEVar5->subtype != TwoHanded) {
    uVar9 = (pEVar6->field_25).scrollmap;
  }
  uVar7 = (this->cosmetic_paperdoll)._M_elems[0];
  uVar4 = (this->cosmetic_paperdoll)._M_elems[4];
  if (uVar7 != 0) {
    uVar10 = uVar7;
  }
  if (uVar4 != 0) {
    uVar8 = uVar4;
  }
  uVar7 = (this->cosmetic_paperdoll)._M_elems[6];
  if (uVar7 != 0) {
    uVar2 = uVar7;
  }
  uVar7 = (this->cosmetic_paperdoll)._M_elems[8];
  if (uVar7 != 0) {
    uVar3 = uVar7;
  }
  uVar7 = (this->cosmetic_paperdoll)._M_elems[7];
  if (uVar7 != 0) {
    uVar9 = uVar7;
  }
  uVar7 = 0;
  if ((short)uVar9 == -1) {
    uVar9 = uVar7;
  }
  uVar4 = uVar3 & 0xffff;
  if ((uVar3 & 0xffff) == 0xffff) {
    uVar4 = uVar7;
  }
  uVar3 = uVar2 & 0xffff;
  if ((uVar2 & 0xffff) == 0xffff) {
    uVar3 = uVar7;
  }
  uVar2 = uVar8 & 0xffff;
  if ((uVar8 & 0xffff) == 0xffff) {
    uVar2 = uVar7;
  }
  uVar8 = uVar10 & 0xffff;
  if ((uVar10 & 0xffff) == 0xffff) {
    uVar8 = uVar7;
  }
  do {
    bVar1 = *format;
    if (bVar1 < 0x48) {
      if (bVar1 < 0x41) {
        if (bVar1 == 0x30) {
          uVar10 = 0;
          goto LAB_00118e79;
        }
        if (bVar1 == 0) {
          return;
        }
      }
      else {
        uVar10 = uVar2;
        if ((bVar1 == 0x41) || (uVar10 = uVar8, bVar1 == 0x42)) {
LAB_00118e79:
          PacketBuilder::AddShort(builder,uVar10);
        }
      }
    }
    else {
      uVar10 = uVar3;
      if (((bVar1 == 0x48) || (uVar10 = uVar9 & 0xffff, bVar1 == 0x53)) ||
         (uVar10 = uVar4, bVar1 == 0x57)) goto LAB_00118e79;
    }
    format = (char *)((byte *)format + 1);
  } while( true );
}

Assistant:

void Character::AddPaperdollData(PacketBuilder& builder, const char* format)
{
	const EIF_Data& wep = this->world->eif->Get(this->paperdoll[Character::Weapon]);

	unsigned short boots = this->world->eif->Get(this->paperdoll[Character::Boots]).dollgraphic;
	unsigned short armor = this->world->eif->Get(this->paperdoll[Character::Armor]).dollgraphic;
	unsigned short hat = this->world->eif->Get(this->paperdoll[Character::Hat]).dollgraphic;
	unsigned short weapon = wep.dollgraphic;
	unsigned short shield = this->world->eif->Get(this->paperdoll[Character::Shield]).dollgraphic;

	if (wep.subtype == EIF::TwoHanded && wep.dual_wield_dollgraphic)
		shield = wep.dual_wield_dollgraphic;

	if (this->cosmetic_paperdoll[Character::Boots])  boots = this->cosmetic_paperdoll[Character::Boots];
	if (this->cosmetic_paperdoll[Character::Armor])  armor = this->cosmetic_paperdoll[Character::Armor];
	if (this->cosmetic_paperdoll[Character::Hat])    hat = this->cosmetic_paperdoll[Character::Hat];
	if (this->cosmetic_paperdoll[Character::Weapon]) weapon = this->cosmetic_paperdoll[Character::Weapon];
	if (this->cosmetic_paperdoll[Character::Shield]) shield = this->cosmetic_paperdoll[Character::Shield];

	if (boots == 65535)  boots = 0;
	if (armor == 65535)  armor = 0;
	if (hat == 65535)    hat = 0;
	if (weapon == 65535) weapon = 0;
	if (shield == 65535) shield = 0;

	for (const char* p = format; *p != '\0'; ++p)
	{
		switch (*p)
		{
			case 'B': builder.AddShort(boots); break;
			case 'A': builder.AddShort(armor); break;
			case 'H': builder.AddShort(hat); break;
			case 'W': builder.AddShort(weapon); break;
			case 'S': builder.AddShort(shield); break;
			case '0': builder.AddShort(0); break;
		}
	}
}